

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O2

int assetsys_file_count(assetsys_t *sys,char *path)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (path == (char *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar1 = assetsys_internal_find_collated(sys,path);
    uVar4 = 0;
    uVar3 = (ulong)(uint)sys->collated_count;
    if (sys->collated_count < 1) {
      uVar3 = uVar4;
    }
    iVar2 = 0;
    for (; uVar3 * 0x18 - uVar4 != 0; uVar4 = uVar4 + 0x18) {
      if (*(int *)((long)&sys->collated->is_file + uVar4) != 0) {
        iVar2 = iVar2 + (uint)(*(int *)((long)&sys->collated->parent + uVar4) == iVar1);
      }
    }
  }
  return iVar2;
}

Assistant:

int assetsys_file_count( assetsys_t* sys, char const* path )
    {
    if( !path ) return 0;
    int dir = assetsys_internal_find_collated( sys, path );
    int count = 0;
    for( int i = 0; i < sys->collated_count; ++i )
        {
        if( sys->collated[ i ].is_file && sys->collated[ i ].parent == dir )
            {
            ++count;
            }
        }
    return count;
    }